

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Bool IsValidNMTOKEN(ctmbstr name)

{
  uint uVar1;
  Bool BVar2;
  uint local_24;
  byte *pbStack_20;
  tchar c;
  ctmbstr s;
  ctmbstr name_local;
  
  pbStack_20 = (byte *)name;
  s = name;
  if (name != (ctmbstr)0x0) {
    do {
      if (*pbStack_20 == 0) {
        return yes;
      }
      local_24 = (uint)*pbStack_20;
      if (0x7f < local_24) {
        uVar1 = prvTidyGetUTF8((ctmbstr)pbStack_20,&local_24);
        pbStack_20 = pbStack_20 + uVar1;
      }
      pbStack_20 = pbStack_20 + 1;
      BVar2 = prvTidyIsXMLNamechar(local_24);
    } while (BVar2 != no);
  }
  return no;
}

Assistant:

static Bool IsValidNMTOKEN(ctmbstr name)
{
    ctmbstr s = name;
    tchar c;

    if (!s)
        return no;

    while (*s)
    {
        c = (unsigned char)*s;

        if (c > 0x7F)
            s += TY_(GetUTF8)(s, &c);

        ++s;

        if (!TY_(IsXMLNamechar)(c))
            return no;
    }

    return yes;
}